

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall PRED<UFPC>::SecondScan(PRED<UFPC> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  uint *puVar3;
  uint uVar4;
  int r_i;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  for (lVar5 = 0; puVar3 = UFPC::P_, lVar5 < *(int *)&pMVar2->field_0x8; lVar5 = lVar5 + 1) {
    lVar6 = **(long **)&pMVar2->field_0x48 * lVar5 + *(long *)&pMVar2->field_0x10;
    iVar1 = *(int *)&pMVar2->field_0xc;
    for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
      *(uint *)(lVar6 + lVar7) = puVar3[*(uint *)(lVar6 + lVar7)];
    }
  }
  return;
}

Assistant:

void SecondScan()
    {
        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }
    }